

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O3

int read_header(FILE *fp,char ***field_names)

{
  char cVar1;
  uint uVar2;
  char **ppcVar3;
  char *pcVar4;
  char **ppcVar5;
  long lVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  char h_field [10000];
  char header [10000];
  char local_4e58 [10000];
  char local_2748 [10008];
  
  if (fp != (FILE *)0x0) {
    ppcVar3 = (char **)malloc(8);
    *field_names = ppcVar3;
    if (ppcVar3 == (char **)0x0) goto LAB_0012fece;
    memset(local_4e58,0,10000);
    pcVar4 = fgets(local_2748,10000,(FILE *)fp);
    if (pcVar4 == (char *)0x0) {
      ppcVar3 = *field_names;
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      while( true ) {
        uVar2 = 0;
        while( true ) {
          do {
            cVar1 = local_2748[lVar6];
            lVar6 = lVar6 + 1;
          } while (cVar1 == '\r');
          if (cVar1 == '\0') goto LAB_0012fed4;
          if ((cVar1 == ',') || (cVar1 == '\n')) break;
          uVar8 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
          local_4e58[uVar8] = cVar1;
        }
        ppcVar3 = (char **)realloc(*field_names,(uVar7 + 1 & 0xffffffff) << 3);
        if (ppcVar3 == (char **)0x0) {
          ppcVar3 = *field_names;
          if (ppcVar3 == (char **)0x0) goto LAB_0012fec7;
          ppcVar5 = ppcVar3;
          if ((int)uVar7 != 0) {
            do {
              free(*ppcVar5);
              uVar7 = uVar7 - 1;
              ppcVar5 = ppcVar5 + 1;
            } while (uVar7 != 0);
          }
          goto LAB_0012fec2;
        }
        *field_names = ppcVar3;
        pcVar4 = strdup(local_4e58);
        ppcVar3[uVar7 & 0xffffffff] = pcVar4;
        if (pcVar4 == (char *)0x0) break;
        memset(local_4e58,0,10000);
        uVar7 = uVar7 + 1;
      }
      if ((int)uVar7 != 0) {
        uVar8 = 0;
        do {
          free(ppcVar3[uVar8]);
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
    }
LAB_0012fec2:
    free(ppcVar3);
  }
LAB_0012fec7:
  *field_names = (char **)0x0;
LAB_0012fece:
  uVar7 = 0xffffffff;
LAB_0012fed4:
  return (int)uVar7;
}

Assistant:

int read_header(FILE *fp, char ***field_names) {
    char **tmp_field_names;
    char header[LINE_MAX_LEN];
    char h_field[LINE_MAX_LEN];
    int h_field_index = 0;
    int h_field_len = 0;

    if (fp == NULL) {
        *field_names = NULL;
        return -1;
    }

    *field_names = malloc(sizeof(char *));
    if (*field_names == NULL) {
        return -1;
    }
    memset(h_field, 0, LINE_MAX_LEN);

    if (fgets(header, LINE_MAX_LEN, fp) == NULL) {
        free(*field_names);
        *field_names = NULL;
        return -1;
    }

    char chr;
    int chr_pos = 0;

    while ((chr = header[++chr_pos - 1])) {
        if (chr == ',' || chr == '\n') {
            tmp_field_names = realloc(*field_names, (h_field_index + 1) * sizeof(char *));
            if (tmp_field_names == NULL) {
                free_cstr_arr(*field_names, h_field_index);
                *field_names = NULL;
                return -1;
            }
            *field_names = tmp_field_names;
            (*field_names)[h_field_index] = strdup(h_field);

            if ((*field_names)[h_field_index] == NULL) {
                free_cstr_arr(*field_names, h_field_index);
                *field_names = NULL;
                return -1;
            }

            memset(h_field, 0, LINE_MAX_LEN);
            h_field_len = 0;
            h_field_index++;
        } else if (chr != '\n' && chr != '\r') {
            h_field[++h_field_len - 1] = chr;
        }
    }

    return h_field_index;
}